

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void Commands::Paperdoll(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  World *pWVar1;
  Character *pCVar2;
  bool bVar3;
  int iVar4;
  const_reference pvVar5;
  Character *this;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  size_type sVar12;
  array<int,_15UL> *this_00;
  iterator pvVar13;
  value_type_conflict1 item;
  iterator __end2;
  iterator __begin2;
  array<int,_15UL> *__range2;
  string local_148 [32];
  undefined1 local_128 [8];
  PacketBuilder reply;
  string rank_str;
  string guild_str;
  string home_str;
  string local_90;
  string local_70;
  string local_40;
  Character *local_20;
  Character *victim;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  pWVar1 = from->world;
  victim = from;
  from_local = (Character *)arguments;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](arguments,0);
  std::__cxx11::string::string((string *)&local_40,(string *)pvVar5);
  this = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pCVar2 = victim;
  local_20 = this;
  if (this == (Character *)0x0) {
    pWVar1 = victim->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"character_not_found",
               (allocator<char> *)(home_str.field_2._M_local_buf + 0xf));
    I18N::Format<>(&local_70,&pWVar1->i18n,&local_90);
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[5])(pCVar2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(home_str.field_2._M_local_buf + 0xf));
  }
  else {
    Character::HomeString_abi_cxx11_((string *)((long)&guild_str.field_2 + 8),this);
    Character::GuildNameString_abi_cxx11_((string *)((long)&rank_str.field_2 + 8),local_20);
    Character::GuildRankString_abi_cxx11_((string *)&reply.add_size,local_20);
    (*(local_20->super_Command_Source)._vptr_Command_Source[2])(local_148);
    lVar6 = std::__cxx11::string::length();
    lVar7 = std::__cxx11::string::length();
    lVar8 = std::__cxx11::string::length();
    lVar9 = std::__cxx11::string::length();
    lVar10 = std::__cxx11::string::length();
    lVar11 = std::__cxx11::string::length();
    sVar12 = std::array<int,_15UL>::size(&local_20->paperdoll);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)local_128,PACKET_PAPERDOLL,PACKET_REPLY,
               lVar6 + lVar7 + lVar8 + lVar9 + lVar10 + lVar11 + 0xc + sVar12 * 2);
    std::__cxx11::string::~string(local_148);
    (*(local_20->super_Command_Source)._vptr_Command_Source[2])(&__range2);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,(string *)&__range2,0xff);
    std::__cxx11::string::~string((string *)&__range2);
    PacketBuilder::AddBreakString
              ((PacketBuilder *)local_128,(string *)((long)&guild_str.field_2 + 8),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,&local_20->partner,0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,&local_20->title,0xff);
    PacketBuilder::AddBreakString
              ((PacketBuilder *)local_128,(string *)((long)&rank_str.field_2 + 8),0xff);
    PacketBuilder::AddBreakString((PacketBuilder *)local_128,(string *)&reply.add_size,0xff);
    iVar4 = Character::PlayerID(local_20);
    PacketBuilder::AddShort((PacketBuilder *)local_128,iVar4);
    PacketBuilder::AddChar((PacketBuilder *)local_128,(uint)local_20->clas);
    PacketBuilder::AddChar((PacketBuilder *)local_128,(uint)local_20->gender);
    PacketBuilder::AddChar((PacketBuilder *)local_128,0);
    this_00 = &local_20->paperdoll;
    __end2 = std::array<int,_15UL>::begin(this_00);
    pvVar13 = std::array<int,_15UL>::end(this_00);
    for (; __end2 != pvVar13; __end2 = __end2 + 1) {
      PacketBuilder::AddShort((PacketBuilder *)local_128,*__end2);
    }
    iVar4 = (*(local_20->super_Command_Source)._vptr_Command_Source[1])();
    if (((byte)iVar4 < 4) || (bVar3 = Character::IsHideAdmin(local_20), bVar3)) {
      iVar4 = (*(local_20->super_Command_Source)._vptr_Command_Source[1])();
      if (((char)iVar4 == '\0') || (bVar3 = Character::IsHideAdmin(local_20), bVar3)) {
        if (local_20->party == (Party *)0x0) {
          PacketBuilder::AddChar((PacketBuilder *)local_128,0);
        }
        else {
          PacketBuilder::AddChar((PacketBuilder *)local_128,6);
        }
      }
      else if (local_20->party == (Party *)0x0) {
        PacketBuilder::AddChar((PacketBuilder *)local_128,4);
      }
      else {
        PacketBuilder::AddChar((PacketBuilder *)local_128,9);
      }
    }
    else if (local_20->party == (Party *)0x0) {
      PacketBuilder::AddChar((PacketBuilder *)local_128,5);
    }
    else {
      PacketBuilder::AddChar((PacketBuilder *)local_128,10);
    }
    Character::Send(victim,(PacketBuilder *)local_128);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_128);
    std::__cxx11::string::~string((string *)&reply.add_size);
    std::__cxx11::string::~string((string *)(rank_str.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(guild_str.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Paperdoll(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		std::string home_str = victim->HomeString();
		std::string guild_str = victim->GuildNameString();
		std::string rank_str = victim->GuildRankString();

		PacketBuilder reply(PACKET_PAPERDOLL, PACKET_REPLY,
			12 + victim->SourceName().length() + home_str.length() + victim->partner.length() + victim->title.length()
			+ guild_str.length() + rank_str.length() + victim->paperdoll.size() * 2);

		reply.AddBreakString(victim->SourceName());
		reply.AddBreakString(home_str);
		reply.AddBreakString(victim->partner);
		reply.AddBreakString(victim->title);
		reply.AddBreakString(guild_str);
		reply.AddBreakString(rank_str);
		reply.AddShort(victim->PlayerID());
		reply.AddChar(victim->clas);
		reply.AddChar(victim->gender);
		reply.AddChar(0);

		UTIL_FOREACH(victim->paperdoll, item)
		{
			reply.AddShort(item);
		}

		if (victim->SourceDutyAccess() >= ADMIN_HGM && !victim->IsHideAdmin())
		{
			if (victim->party)
			{
				reply.AddChar(ICON_HGM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_HGM);
			}
		}
		else if (victim->SourceDutyAccess() >= ADMIN_GUIDE && !victim->IsHideAdmin())
		{
			if (victim->party)
			{
				reply.AddChar(ICON_GM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_GM);
			}
		}
		else
		{
			if (victim->party)
			{
				reply.AddChar(ICON_PARTY);
			}
			else
			{
				reply.AddChar(ICON_NORMAL);
			}
		}

		from->Send(reply);
	}
}